

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  float fVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  Geometry *pGVar6;
  long lVar7;
  RTCFilterFunctionN p_Var8;
  byte bVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  AABBNodeMB4D *node1;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  size_t sVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  bool bVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [64];
  float fVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar65;
  float fVar66;
  float fVar67;
  undefined1 auVar64 [64];
  uint uVar69;
  uint uVar70;
  uint uVar71;
  undefined1 auVar68 [64];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [64];
  undefined1 auVar75 [16];
  undefined1 auVar76 [64];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 local_1508 [16];
  undefined1 (*local_14f8) [16];
  ulong local_14f0;
  NodeRef *local_14e8;
  Scene *scene;
  long local_14d8;
  ulong local_14d0;
  ulong local_14c8;
  ulong local_14c0;
  RTCFilterFunctionNArguments args;
  undefined8 local_1448;
  undefined8 uStack_1440;
  undefined8 local_1438;
  undefined8 uStack_1430;
  undefined1 local_1428 [16];
  undefined1 local_1418 [16];
  undefined1 local_1408 [16];
  undefined1 local_13f8 [16];
  undefined1 local_13d8 [16];
  float local_13c8 [4];
  undefined1 local_13b8 [16];
  float local_13a8 [4];
  undefined1 local_1398 [16];
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  RTCHitN local_1368 [16];
  undefined1 local_1358 [16];
  undefined1 local_1348 [16];
  undefined4 local_1338;
  undefined4 uStack_1334;
  undefined4 uStack_1330;
  undefined4 uStack_132c;
  undefined1 local_1328 [16];
  undefined1 local_1318 [16];
  undefined1 local_1308 [16];
  uint local_12f8;
  uint uStack_12f4;
  uint uStack_12f0;
  uint uStack_12ec;
  uint uStack_12e8;
  uint uStack_12e4;
  uint uStack_12e0;
  uint uStack_12dc;
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  NodeRef stack [564];
  
  local_14e8 = stack + 1;
  stack[0] = root;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_11f8._4_4_ = fVar2;
  local_11f8._0_4_ = fVar2;
  local_11f8._8_4_ = fVar2;
  local_11f8._12_4_ = fVar2;
  local_11f8._16_4_ = fVar2;
  local_11f8._20_4_ = fVar2;
  local_11f8._24_4_ = fVar2;
  local_11f8._28_4_ = fVar2;
  auVar50 = ZEXT3264(local_11f8);
  fVar60 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_1218._4_4_ = fVar60;
  local_1218._0_4_ = fVar60;
  local_1218._8_4_ = fVar60;
  local_1218._12_4_ = fVar60;
  local_1218._16_4_ = fVar60;
  local_1218._20_4_ = fVar60;
  local_1218._24_4_ = fVar60;
  local_1218._28_4_ = fVar60;
  auVar54 = ZEXT3264(local_1218);
  fVar65 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1238._4_4_ = fVar65;
  local_1238._0_4_ = fVar65;
  local_1238._8_4_ = fVar65;
  local_1238._12_4_ = fVar65;
  local_1238._16_4_ = fVar65;
  local_1238._20_4_ = fVar65;
  local_1238._24_4_ = fVar65;
  local_1238._28_4_ = fVar65;
  auVar55 = ZEXT3264(local_1238);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar60 = fVar60 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar65 = fVar65 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_14f0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar18 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar28 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar29 = local_14f0 ^ 0x20;
  local_1258._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  local_1258._8_4_ = -fVar2;
  local_1258._12_4_ = -fVar2;
  local_1258._16_4_ = -fVar2;
  local_1258._20_4_ = -fVar2;
  local_1258._24_4_ = -fVar2;
  local_1258._28_4_ = -fVar2;
  auVar59 = ZEXT3264(local_1258);
  local_1278._0_8_ = CONCAT44(fVar60,fVar60) ^ 0x8000000080000000;
  local_1278._8_4_ = -fVar60;
  local_1278._12_4_ = -fVar60;
  local_1278._16_4_ = -fVar60;
  local_1278._20_4_ = -fVar60;
  local_1278._24_4_ = -fVar60;
  local_1278._28_4_ = -fVar60;
  auVar64 = ZEXT3264(local_1278);
  local_1298._0_8_ = CONCAT44(fVar65,fVar65) ^ 0x8000000080000000;
  local_1298._8_4_ = -fVar65;
  local_1298._12_4_ = -fVar65;
  local_1298._16_4_ = -fVar65;
  local_1298._20_4_ = -fVar65;
  local_1298._24_4_ = -fVar65;
  local_1298._28_4_ = -fVar65;
  auVar68 = ZEXT3264(local_1298);
  iVar3 = (tray->tnear).field_0.i[k];
  local_12b8._4_4_ = iVar3;
  local_12b8._0_4_ = iVar3;
  local_12b8._8_4_ = iVar3;
  local_12b8._12_4_ = iVar3;
  local_12b8._16_4_ = iVar3;
  local_12b8._20_4_ = iVar3;
  local_12b8._24_4_ = iVar3;
  local_12b8._28_4_ = iVar3;
  auVar74 = ZEXT3264(local_12b8);
  iVar3 = (tray->tfar).field_0.i[k];
  local_12d8._4_4_ = iVar3;
  local_12d8._0_4_ = iVar3;
  local_12d8._8_4_ = iVar3;
  local_12d8._12_4_ = iVar3;
  local_12d8._16_4_ = iVar3;
  local_12d8._20_4_ = iVar3;
  local_12d8._24_4_ = iVar3;
  local_12d8._28_4_ = iVar3;
  auVar76 = ZEXT3264(local_12d8);
  local_14f8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  bVar31 = true;
  uVar27 = local_14f0;
LAB_005cf08c:
  do {
    sVar26 = local_14e8[-1].ptr;
    local_14e8 = local_14e8 + -1;
    while ((sVar26 & 8) == 0) {
      uVar13 = sVar26 & 0xfffffffffffffff0;
      uVar4 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar38._4_4_ = uVar4;
      auVar38._0_4_ = uVar4;
      auVar38._8_4_ = uVar4;
      auVar38._12_4_ = uVar4;
      auVar38._16_4_ = uVar4;
      auVar38._20_4_ = uVar4;
      auVar38._24_4_ = uVar4;
      auVar38._28_4_ = uVar4;
      auVar32 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar13 + 0x100 + uVar27),auVar38,
                                *(undefined1 (*) [32])(uVar13 + 0x40 + uVar27));
      auVar32 = vfmadd213ps_fma(ZEXT1632(auVar32),auVar50._0_32_,auVar59._0_32_);
      auVar37 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar13 + 0x100 + uVar18),auVar38,
                                *(undefined1 (*) [32])(uVar13 + 0x40 + uVar18));
      auVar37 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar54._0_32_,auVar64._0_32_);
      auVar10 = vpmaxsd_avx2(ZEXT1632(auVar32),ZEXT1632(auVar37));
      auVar32 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar13 + 0x100 + uVar28),auVar38,
                                *(undefined1 (*) [32])(uVar13 + 0x40 + uVar28));
      auVar32 = vfmadd213ps_fma(ZEXT1632(auVar32),auVar55._0_32_,auVar68._0_32_);
      auVar11 = vpmaxsd_avx2(ZEXT1632(auVar32),auVar74._0_32_);
      auVar32 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar13 + 0x100 + uVar29),auVar38,
                                *(undefined1 (*) [32])(uVar13 + 0x40 + uVar29));
      auVar10 = vpmaxsd_avx2(auVar10,auVar11);
      auVar37 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar13 + 0x100 + (uVar18 ^ 0x20)),auVar38,
                                *(undefined1 (*) [32])(uVar13 + 0x40 + (uVar18 ^ 0x20)));
      auVar32 = vfmadd213ps_fma(ZEXT1632(auVar32),auVar50._0_32_,auVar59._0_32_);
      auVar37 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar54._0_32_,auVar64._0_32_);
      auVar11 = vpminsd_avx2(ZEXT1632(auVar32),ZEXT1632(auVar37));
      auVar32 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar13 + 0x100 + (uVar28 ^ 0x20)),auVar38,
                                *(undefined1 (*) [32])(uVar13 + 0x40 + (uVar28 ^ 0x20)));
      auVar32 = vfmadd213ps_fma(ZEXT1632(auVar32),auVar55._0_32_,auVar68._0_32_);
      auVar12 = vpminsd_avx2(ZEXT1632(auVar32),auVar76._0_32_);
      auVar11 = vpminsd_avx2(auVar11,auVar12);
      auVar10 = vcmpps_avx(auVar10,auVar11,2);
      if (((uint)sVar26 & 7) == 6) {
        auVar11 = vcmpps_avx(*(undefined1 (*) [32])(uVar13 + 0x1c0),auVar38,2);
        auVar12 = vcmpps_avx(auVar38,*(undefined1 (*) [32])(uVar13 + 0x1e0),1);
        auVar11 = vandps_avx(auVar11,auVar12);
        auVar10 = vandps_avx(auVar11,auVar10);
        auVar32 = vpackssdw_avx(auVar10._0_16_,auVar10._16_16_);
      }
      else {
        auVar32 = vpackssdw_avx(auVar10._0_16_,auVar10._16_16_);
      }
      auVar32 = vpsllw_avx(auVar32,0xf);
      if ((((((((auVar32 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar32 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar32 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar32 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar32 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar32 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar32 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar32[0xf])
      {
        bVar31 = local_14e8 != stack;
        if (!bVar31) {
          return bVar31;
        }
        goto LAB_005cf08c;
      }
      auVar32 = vpacksswb_avx(auVar32,auVar32);
      bVar9 = SUB161(auVar32 >> 7,0) & 1 | (SUB161(auVar32 >> 0xf,0) & 1) << 1 |
              (SUB161(auVar32 >> 0x17,0) & 1) << 2 | (SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
              (SUB161(auVar32 >> 0x27,0) & 1) << 4 | (SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
              (SUB161(auVar32 >> 0x37,0) & 1) << 6 | SUB161(auVar32 >> 0x3f,0) << 7;
      lVar17 = 0;
      for (uVar19 = (ulong)bVar9; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
        lVar17 = lVar17 + 1;
      }
      sVar26 = *(size_t *)(uVar13 + lVar17 * 8);
      uVar21 = bVar9 - 1 & (uint)bVar9;
      uVar19 = (ulong)uVar21;
      if (uVar21 != 0) {
        local_14e8->ptr = sVar26;
        lVar17 = 0;
        for (; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
          lVar17 = lVar17 + 1;
        }
        uVar21 = uVar21 - 1 & uVar21;
        uVar19 = (ulong)uVar21;
        bVar30 = uVar21 == 0;
        while( true ) {
          local_14e8 = local_14e8 + 1;
          sVar26 = *(size_t *)(uVar13 + lVar17 * 8);
          if (bVar30) break;
          local_14e8->ptr = sVar26;
          lVar17 = 0;
          for (uVar15 = uVar19; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
            lVar17 = lVar17 + 1;
          }
          uVar19 = uVar19 - 1 & uVar19;
          bVar30 = uVar19 == 0;
        }
      }
    }
    local_14d8 = (ulong)((uint)sVar26 & 0xf) - 8;
    if (local_14d8 != 0) {
      uVar27 = sVar26 & 0xfffffffffffffff0;
      lVar17 = 0;
      do {
        lVar16 = lVar17 * 0x50;
        scene = context->scene;
        pGVar6 = (scene->geometries).items[*(uint *)(uVar27 + 0x30 + lVar16)].ptr;
        fVar2 = (pGVar6->time_range).lower;
        fVar2 = pGVar6->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar2) / ((pGVar6->time_range).upper - fVar2));
        auVar32 = vroundss_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2),9);
        auVar32 = vminss_avx(auVar32,ZEXT416((uint)(pGVar6->fnumTimeSegments + -1.0)));
        auVar43 = vmaxss_avx(ZEXT816(0),auVar32);
        lVar14 = (long)(int)auVar43._0_4_ * 0x38;
        uVar25 = (ulong)*(uint *)(uVar27 + 4 + lVar16);
        lVar7 = *(long *)(*(long *)&pGVar6[2].numPrimitives + lVar14);
        lVar14 = *(long *)(*(long *)&pGVar6[2].numPrimitives + 0x38 + lVar14);
        auVar32 = *(undefined1 (*) [16])(lVar7 + (ulong)*(uint *)(uVar27 + lVar16) * 4);
        uVar20 = (ulong)*(uint *)(uVar27 + 0x10 + lVar16);
        auVar37 = *(undefined1 (*) [16])(lVar7 + uVar20 * 4);
        uVar13 = (ulong)*(uint *)(uVar27 + 0x20 + lVar16);
        auVar48 = *(undefined1 (*) [16])(lVar7 + uVar13 * 4);
        auVar33 = *(undefined1 (*) [16])(lVar7 + uVar25 * 4);
        uVar19 = (ulong)*(uint *)(uVar27 + 0x14 + lVar16);
        auVar63 = *(undefined1 (*) [16])(lVar7 + uVar19 * 4);
        uVar15 = (ulong)*(uint *)(uVar27 + 0x24 + lVar16);
        auVar58 = *(undefined1 (*) [16])(lVar7 + uVar15 * 4);
        uVar24 = (ulong)*(uint *)(uVar27 + 8 + lVar16);
        auVar39 = *(undefined1 (*) [16])(lVar7 + uVar24 * 4);
        local_14c8 = (ulong)*(uint *)(uVar27 + 0x18 + lVar16);
        auVar57 = *(undefined1 (*) [16])(lVar7 + local_14c8 * 4);
        uVar22 = (ulong)*(uint *)(uVar27 + 0x28 + lVar16);
        auVar40 = *(undefined1 (*) [16])(lVar7 + uVar22 * 4);
        uVar23 = (ulong)*(uint *)(uVar27 + 0xc + lVar16);
        auVar44 = *(undefined1 (*) [16])(lVar7 + uVar23 * 4);
        local_14d0 = (ulong)*(uint *)(uVar27 + 0x1c + lVar16);
        auVar34 = *(undefined1 (*) [16])(lVar7 + local_14d0 * 4);
        local_14c0 = (ulong)*(uint *)(uVar27 + 0x2c + lVar16);
        auVar35 = *(undefined1 (*) [16])(lVar7 + local_14c0 * 4);
        auVar36 = *(undefined1 (*) [16])(lVar14 + (ulong)*(uint *)(uVar27 + lVar16) * 4);
        auVar51 = *(undefined1 (*) [16])(lVar14 + uVar20 * 4);
        fVar2 = fVar2 - auVar43._0_4_;
        auVar43 = vunpcklps_avx(auVar32,auVar39);
        auVar39 = vunpckhps_avx(auVar32,auVar39);
        auVar56 = vunpcklps_avx(auVar33,auVar44);
        auVar33 = vunpckhps_avx(auVar33,auVar44);
        auVar32 = *(undefined1 (*) [16])(lVar14 + uVar25 * 4);
        auVar46 = vunpcklps_avx(auVar39,auVar33);
        auVar47 = vunpcklps_avx(auVar43,auVar56);
        auVar39 = vunpckhps_avx(auVar43,auVar56);
        auVar44 = vunpcklps_avx(auVar37,auVar57);
        auVar33 = vunpckhps_avx(auVar37,auVar57);
        auVar57 = vunpcklps_avx(auVar63,auVar34);
        auVar63 = vunpckhps_avx(auVar63,auVar34);
        auVar37 = *(undefined1 (*) [16])(lVar14 + uVar24 * 4);
        auVar34 = vunpcklps_avx(auVar33,auVar63);
        auVar43 = vunpcklps_avx(auVar44,auVar57);
        auVar63 = vunpckhps_avx(auVar44,auVar57);
        auVar44 = vunpcklps_avx(auVar48,auVar40);
        auVar57 = vunpckhps_avx(auVar48,auVar40);
        auVar56 = vunpcklps_avx(auVar58,auVar35);
        auVar40 = vunpckhps_avx(auVar58,auVar35);
        auVar33 = *(undefined1 (*) [16])(lVar14 + uVar23 * 4);
        auVar35 = vunpcklps_avx(auVar57,auVar40);
        auVar48 = vunpcklps_avx(auVar44,auVar56);
        auVar57 = vunpckhps_avx(auVar44,auVar56);
        auVar40 = vunpcklps_avx(auVar36,auVar37);
        auVar37 = vunpckhps_avx(auVar36,auVar37);
        auVar44 = vunpcklps_avx(auVar32,auVar33);
        auVar33 = vunpckhps_avx(auVar32,auVar33);
        auVar32 = *(undefined1 (*) [16])(lVar14 + local_14c8 * 4);
        auVar36 = vunpcklps_avx(auVar37,auVar33);
        auVar56 = vunpcklps_avx(auVar40,auVar44);
        auVar33 = vunpckhps_avx(auVar40,auVar44);
        auVar44 = vunpcklps_avx(auVar51,auVar32);
        auVar40 = vunpckhps_avx(auVar51,auVar32);
        auVar32 = *(undefined1 (*) [16])(lVar14 + uVar19 * 4);
        auVar37 = *(undefined1 (*) [16])(lVar14 + local_14d0 * 4);
        auVar51 = vunpcklps_avx(auVar32,auVar37);
        auVar32 = vunpckhps_avx(auVar32,auVar37);
        auVar58 = vunpcklps_avx(auVar40,auVar32);
        auVar62 = vunpcklps_avx(auVar44,auVar51);
        auVar40 = vunpckhps_avx(auVar44,auVar51);
        auVar32 = *(undefined1 (*) [16])(lVar14 + uVar13 * 4);
        auVar37 = *(undefined1 (*) [16])(lVar14 + uVar22 * 4);
        auVar51 = vunpcklps_avx(auVar32,auVar37);
        auVar44 = vunpckhps_avx(auVar32,auVar37);
        auVar32 = *(undefined1 (*) [16])(lVar14 + uVar15 * 4);
        auVar37 = *(undefined1 (*) [16])(lVar14 + local_14c0 * 4);
        auVar61 = vunpcklps_avx(auVar32,auVar37);
        auVar32 = vunpckhps_avx(auVar32,auVar37);
        auVar37 = vunpcklps_avx(auVar44,auVar32);
        auVar44 = vunpcklps_avx(auVar51,auVar61);
        auVar32 = vunpckhps_avx(auVar51,auVar61);
        fVar60 = 1.0 - fVar2;
        auVar77._4_4_ = fVar60;
        auVar77._0_4_ = fVar60;
        auVar77._8_4_ = fVar60;
        auVar77._12_4_ = fVar60;
        auVar51._0_4_ = fVar2 * auVar56._0_4_;
        auVar51._4_4_ = fVar2 * auVar56._4_4_;
        auVar51._8_4_ = fVar2 * auVar56._8_4_;
        auVar51._12_4_ = fVar2 * auVar56._12_4_;
        auVar51 = vfmadd231ps_fma(auVar51,auVar77,auVar47);
        auVar56._0_4_ = fVar2 * auVar33._0_4_;
        auVar56._4_4_ = fVar2 * auVar33._4_4_;
        auVar56._8_4_ = fVar2 * auVar33._8_4_;
        auVar56._12_4_ = fVar2 * auVar33._12_4_;
        auVar56 = vfmadd231ps_fma(auVar56,auVar77,auVar39);
        auVar61._0_4_ = fVar2 * auVar36._0_4_;
        auVar61._4_4_ = fVar2 * auVar36._4_4_;
        auVar61._8_4_ = fVar2 * auVar36._8_4_;
        auVar61._12_4_ = fVar2 * auVar36._12_4_;
        auVar36 = vfmadd231ps_fma(auVar61,auVar77,auVar46);
        auVar33._0_4_ = fVar2 * auVar62._0_4_;
        auVar33._4_4_ = fVar2 * auVar62._4_4_;
        auVar33._8_4_ = fVar2 * auVar62._8_4_;
        auVar33._12_4_ = fVar2 * auVar62._12_4_;
        auVar33 = vfmadd231ps_fma(auVar33,auVar77,auVar43);
        auVar39._0_4_ = fVar2 * auVar40._0_4_;
        auVar39._4_4_ = fVar2 * auVar40._4_4_;
        auVar39._8_4_ = fVar2 * auVar40._8_4_;
        auVar39._12_4_ = fVar2 * auVar40._12_4_;
        auVar63 = vfmadd231ps_fma(auVar39,auVar77,auVar63);
        auVar43._0_4_ = fVar2 * auVar58._0_4_;
        auVar43._4_4_ = fVar2 * auVar58._4_4_;
        auVar43._8_4_ = fVar2 * auVar58._8_4_;
        auVar43._12_4_ = fVar2 * auVar58._12_4_;
        auVar39 = vfmadd231ps_fma(auVar43,auVar77,auVar34);
        puVar1 = (undefined8 *)(uVar27 + 0x30 + lVar16);
        local_1438 = *puVar1;
        uStack_1430 = puVar1[1];
        puVar1 = (undefined8 *)(uVar27 + 0x40 + lVar16);
        auVar47._0_4_ = fVar2 * auVar44._0_4_;
        auVar47._4_4_ = fVar2 * auVar44._4_4_;
        auVar47._8_4_ = fVar2 * auVar44._8_4_;
        auVar47._12_4_ = fVar2 * auVar44._12_4_;
        auVar72._0_4_ = fVar2 * auVar32._0_4_;
        auVar72._4_4_ = fVar2 * auVar32._4_4_;
        auVar72._8_4_ = fVar2 * auVar32._8_4_;
        auVar72._12_4_ = fVar2 * auVar32._12_4_;
        auVar79._0_4_ = fVar2 * auVar37._0_4_;
        auVar79._4_4_ = fVar2 * auVar37._4_4_;
        auVar79._8_4_ = fVar2 * auVar37._8_4_;
        auVar79._12_4_ = fVar2 * auVar37._12_4_;
        auVar40 = vfmadd231ps_fma(auVar47,auVar77,auVar48);
        auVar57 = vfmadd231ps_fma(auVar72,auVar77,auVar57);
        auVar44 = vfmadd231ps_fma(auVar79,auVar77,auVar35);
        local_1448 = *puVar1;
        uStack_1440 = puVar1[1];
        auVar37 = vsubps_avx(auVar51,auVar33);
        auVar32 = vsubps_avx(auVar56,auVar63);
        auVar33 = vsubps_avx(auVar36,auVar39);
        auVar63 = vsubps_avx(auVar40,auVar51);
        auVar39 = vsubps_avx(auVar57,auVar56);
        auVar57 = vsubps_avx(auVar44,auVar36);
        auVar40._0_4_ = auVar32._0_4_ * auVar57._0_4_;
        auVar40._4_4_ = auVar32._4_4_ * auVar57._4_4_;
        auVar40._8_4_ = auVar32._8_4_ * auVar57._8_4_;
        auVar40._12_4_ = auVar32._12_4_ * auVar57._12_4_;
        local_1398 = vfmsub231ps_fma(auVar40,auVar39,auVar33);
        auVar46._0_4_ = auVar33._0_4_ * auVar63._0_4_;
        auVar46._4_4_ = auVar33._4_4_ * auVar63._4_4_;
        auVar46._8_4_ = auVar33._8_4_ * auVar63._8_4_;
        auVar46._12_4_ = auVar33._12_4_ * auVar63._12_4_;
        local_1388 = vfmsub231ps_fma(auVar46,auVar57,auVar37);
        uVar4 = *(undefined4 *)(ray + k * 4);
        auVar44._4_4_ = uVar4;
        auVar44._0_4_ = uVar4;
        auVar44._8_4_ = uVar4;
        auVar44._12_4_ = uVar4;
        uVar4 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar48._4_4_ = uVar4;
        auVar48._0_4_ = uVar4;
        auVar48._8_4_ = uVar4;
        auVar48._12_4_ = uVar4;
        uVar4 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar34._4_4_ = uVar4;
        auVar34._0_4_ = uVar4;
        auVar34._8_4_ = uVar4;
        auVar34._12_4_ = uVar4;
        fVar2 = *(float *)(ray + k * 4 + 0x40);
        auVar78._4_4_ = fVar2;
        auVar78._0_4_ = fVar2;
        auVar78._8_4_ = fVar2;
        auVar78._12_4_ = fVar2;
        auVar40 = vsubps_avx(auVar51,auVar44);
        fVar60 = *(float *)(ray + k * 4 + 0x50);
        auVar80._4_4_ = fVar60;
        auVar80._0_4_ = fVar60;
        auVar80._8_4_ = fVar60;
        auVar80._12_4_ = fVar60;
        auVar44 = vsubps_avx(auVar56,auVar48);
        fVar65 = *(float *)(ray + k * 4 + 0x60);
        auVar81._4_4_ = fVar65;
        auVar81._0_4_ = fVar65;
        auVar81._8_4_ = fVar65;
        auVar81._12_4_ = fVar65;
        auVar34 = vsubps_avx(auVar36,auVar34);
        auVar35._0_4_ = fVar2 * auVar44._0_4_;
        auVar35._4_4_ = fVar2 * auVar44._4_4_;
        auVar35._8_4_ = fVar2 * auVar44._8_4_;
        auVar35._12_4_ = fVar2 * auVar44._12_4_;
        auVar35 = vfmsub231ps_fma(auVar35,auVar40,auVar80);
        auVar62._0_4_ = auVar57._0_4_ * auVar35._0_4_;
        auVar62._4_4_ = auVar57._4_4_ * auVar35._4_4_;
        auVar62._8_4_ = auVar57._8_4_ * auVar35._8_4_;
        auVar62._12_4_ = auVar57._12_4_ * auVar35._12_4_;
        auVar36._0_4_ = auVar33._0_4_ * auVar35._0_4_;
        auVar36._4_4_ = auVar33._4_4_ * auVar35._4_4_;
        auVar36._8_4_ = auVar33._8_4_ * auVar35._8_4_;
        auVar36._12_4_ = auVar33._12_4_ * auVar35._12_4_;
        auVar57._0_4_ = fVar65 * auVar40._0_4_;
        auVar57._4_4_ = fVar65 * auVar40._4_4_;
        auVar57._8_4_ = fVar65 * auVar40._8_4_;
        auVar57._12_4_ = fVar65 * auVar40._12_4_;
        auVar57 = vfmsub231ps_fma(auVar57,auVar34,auVar78);
        auVar33 = vfmadd231ps_fma(auVar62,auVar57,auVar39);
        auVar57 = vfmadd231ps_fma(auVar36,auVar32,auVar57);
        auVar58._0_4_ = auVar39._0_4_ * auVar37._0_4_;
        auVar58._4_4_ = auVar39._4_4_ * auVar37._4_4_;
        auVar58._8_4_ = auVar39._8_4_ * auVar37._8_4_;
        auVar58._12_4_ = auVar39._12_4_ * auVar37._12_4_;
        local_1378 = vfmsub231ps_fma(auVar58,auVar63,auVar32);
        auVar73._0_4_ = fVar60 * auVar34._0_4_;
        auVar73._4_4_ = fVar60 * auVar34._4_4_;
        auVar73._8_4_ = fVar60 * auVar34._8_4_;
        auVar73._12_4_ = fVar60 * auVar34._12_4_;
        auVar35 = vfmsub231ps_fma(auVar73,auVar44,auVar81);
        auVar75._0_4_ = fVar65 * local_1378._0_4_;
        auVar75._4_4_ = fVar65 * local_1378._4_4_;
        auVar75._8_4_ = fVar65 * local_1378._8_4_;
        auVar75._12_4_ = fVar65 * local_1378._12_4_;
        auVar32 = vfmadd231ps_fma(auVar75,local_1388,auVar80);
        auVar39 = vfmadd231ps_fma(auVar32,local_1398,auVar78);
        auVar32._8_4_ = 0x80000000;
        auVar32._0_8_ = 0x8000000080000000;
        auVar32._12_4_ = 0x80000000;
        auVar33 = vfmadd231ps_fma(auVar33,auVar35,auVar63);
        auVar32 = vandps_avx(auVar39,auVar32);
        uVar21 = auVar32._0_4_;
        local_1428._0_4_ = (float)(uVar21 ^ auVar33._0_4_);
        uVar69 = auVar32._4_4_;
        local_1428._4_4_ = (float)(uVar69 ^ auVar33._4_4_);
        uVar70 = auVar32._8_4_;
        local_1428._8_4_ = (float)(uVar70 ^ auVar33._8_4_);
        uVar71 = auVar32._12_4_;
        local_1428._12_4_ = (float)(uVar71 ^ auVar33._12_4_);
        auVar32 = vfmadd231ps_fma(auVar57,auVar37,auVar35);
        local_1418._0_4_ = (float)(uVar21 ^ auVar32._0_4_);
        local_1418._4_4_ = (float)(uVar69 ^ auVar32._4_4_);
        local_1418._8_4_ = (float)(uVar70 ^ auVar32._8_4_);
        local_1418._12_4_ = (float)(uVar71 ^ auVar32._12_4_);
        auVar33 = ZEXT816(0) << 0x20;
        auVar32 = vcmpps_avx(local_1428,auVar33,5);
        auVar37 = vcmpps_avx(local_1418,auVar33,5);
        auVar32 = vandps_avx(auVar37,auVar32);
        auVar63._8_4_ = 0x7fffffff;
        auVar63._0_8_ = 0x7fffffff7fffffff;
        auVar63._12_4_ = 0x7fffffff;
        local_13f8 = vandps_avx(auVar39,auVar63);
        auVar37 = vcmpps_avx(auVar39,auVar33,4);
        auVar32 = vandps_avx(auVar37,auVar32);
        auVar37._0_4_ = local_1428._0_4_ + local_1418._0_4_;
        auVar37._4_4_ = local_1428._4_4_ + local_1418._4_4_;
        auVar37._8_4_ = local_1428._8_4_ + local_1418._8_4_;
        auVar37._12_4_ = local_1428._12_4_ + local_1418._12_4_;
        auVar37 = vcmpps_avx(auVar37,local_13f8,2);
        auVar33 = auVar37 & auVar32;
        if ((((auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar33[0xf] < '\0') {
          auVar32 = vandps_avx(auVar32,auVar37);
          auVar52._0_4_ = local_1378._0_4_ * auVar34._0_4_;
          auVar52._4_4_ = local_1378._4_4_ * auVar34._4_4_;
          auVar52._8_4_ = local_1378._8_4_ * auVar34._8_4_;
          auVar52._12_4_ = local_1378._12_4_ * auVar34._12_4_;
          auVar37 = vfmadd213ps_fma(auVar44,local_1388,auVar52);
          auVar37 = vfmadd213ps_fma(auVar40,local_1398,auVar37);
          local_1408._0_4_ = (float)(uVar21 ^ auVar37._0_4_);
          local_1408._4_4_ = (float)(uVar69 ^ auVar37._4_4_);
          local_1408._8_4_ = (float)(uVar70 ^ auVar37._8_4_);
          local_1408._12_4_ = (float)(uVar71 ^ auVar37._12_4_);
          fVar2 = *(float *)(ray + k * 4 + 0x30);
          auVar49._0_4_ = local_13f8._0_4_ * fVar2;
          auVar49._4_4_ = local_13f8._4_4_ * fVar2;
          auVar49._8_4_ = local_13f8._8_4_ * fVar2;
          auVar49._12_4_ = local_13f8._12_4_ * fVar2;
          auVar37 = vcmpps_avx(auVar49,local_1408,1);
          fVar2 = *(float *)(ray + k * 4 + 0x80);
          auVar53._0_4_ = local_13f8._0_4_ * fVar2;
          auVar53._4_4_ = local_13f8._4_4_ * fVar2;
          auVar53._8_4_ = local_13f8._8_4_ * fVar2;
          auVar53._12_4_ = local_13f8._12_4_ * fVar2;
          auVar33 = vcmpps_avx(local_1408,auVar53,2);
          auVar37 = vandps_avx(auVar37,auVar33);
          local_13d8 = vandps_avx(auVar37,auVar32);
          uVar21 = vmovmskps_avx(local_13d8);
          if (uVar21 != 0) {
            auVar32 = vrcpps_avx(local_13f8);
            auVar41._8_4_ = 0x3f800000;
            auVar41._0_8_ = 0x3f8000003f800000;
            auVar41._12_4_ = 0x3f800000;
            auVar37 = vfnmadd213ps_fma(local_13f8,auVar32,auVar41);
            auVar32 = vfmadd132ps_fma(auVar37,auVar32,auVar32);
            fVar60 = auVar32._0_4_;
            fVar65 = auVar32._4_4_;
            fVar66 = auVar32._8_4_;
            fVar67 = auVar32._12_4_;
            local_13a8[0] = fVar60 * local_1408._0_4_;
            local_13a8[1] = fVar65 * local_1408._4_4_;
            local_13a8[2] = fVar66 * local_1408._8_4_;
            local_13a8[3] = fVar67 * local_1408._12_4_;
            local_13c8[0] = fVar60 * local_1428._0_4_;
            local_13c8[1] = fVar65 * local_1428._4_4_;
            local_13c8[2] = fVar66 * local_1428._8_4_;
            local_13c8[3] = fVar67 * local_1428._12_4_;
            local_13b8._0_4_ = fVar60 * local_1418._0_4_;
            local_13b8._4_4_ = fVar65 * local_1418._4_4_;
            local_13b8._8_4_ = fVar66 * local_1418._8_4_;
            local_13b8._12_4_ = fVar67 * local_1418._12_4_;
            uVar13 = (ulong)(uVar21 & 0xff);
            do {
              uVar19 = 0;
              for (uVar15 = uVar13; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
                uVar19 = uVar19 + 1;
              }
              uVar21 = *(uint *)((long)&local_1438 + uVar19 * 4);
              pGVar6 = (scene->geometries).items[uVar21].ptr;
              if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_005cfadf:
                  *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                  return bVar31;
                }
                uVar15 = (ulong)(uint)((int)uVar19 * 4);
                local_1338 = *(undefined4 *)((long)local_13c8 + uVar15);
                uVar4 = *(undefined4 *)(local_13b8 + uVar15);
                local_1328._4_4_ = uVar4;
                local_1328._0_4_ = uVar4;
                local_1328._8_4_ = uVar4;
                local_1328._12_4_ = uVar4;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)((long)local_13a8 + uVar15);
                args.context = context->user;
                local_1308._4_4_ = uVar21;
                local_1308._0_4_ = uVar21;
                local_1308._8_4_ = uVar21;
                local_1308._12_4_ = uVar21;
                uVar4 = *(undefined4 *)((long)&local_1448 + uVar15);
                local_1318._4_4_ = uVar4;
                local_1318._0_4_ = uVar4;
                local_1318._8_4_ = uVar4;
                local_1318._12_4_ = uVar4;
                uVar4 = *(undefined4 *)(local_1398 + uVar15);
                uVar5 = *(undefined4 *)(local_1388 + uVar15);
                local_1358._4_4_ = uVar5;
                local_1358._0_4_ = uVar5;
                local_1358._8_4_ = uVar5;
                local_1358._12_4_ = uVar5;
                uVar5 = *(undefined4 *)(local_1378 + uVar15);
                local_1348._4_4_ = uVar5;
                local_1348._0_4_ = uVar5;
                local_1348._8_4_ = uVar5;
                local_1348._12_4_ = uVar5;
                local_1368[0] = (RTCHitN)(char)uVar4;
                local_1368[1] = (RTCHitN)(char)((uint)uVar4 >> 8);
                local_1368[2] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                local_1368[3] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                local_1368[4] = (RTCHitN)(char)uVar4;
                local_1368[5] = (RTCHitN)(char)((uint)uVar4 >> 8);
                local_1368[6] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                local_1368[7] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                local_1368[8] = (RTCHitN)(char)uVar4;
                local_1368[9] = (RTCHitN)(char)((uint)uVar4 >> 8);
                local_1368[10] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                local_1368[0xb] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                local_1368[0xc] = (RTCHitN)(char)uVar4;
                local_1368[0xd] = (RTCHitN)(char)((uint)uVar4 >> 8);
                local_1368[0xe] = (RTCHitN)(char)((uint)uVar4 >> 0x10);
                local_1368[0xf] = (RTCHitN)(char)((uint)uVar4 >> 0x18);
                uStack_1334 = local_1338;
                uStack_1330 = local_1338;
                uStack_132c = local_1338;
                vpcmpeqd_avx2(ZEXT1632(local_1308),ZEXT1632(local_1308));
                uStack_12f4 = (args.context)->instID[0];
                local_12f8 = uStack_12f4;
                uStack_12f0 = uStack_12f4;
                uStack_12ec = uStack_12f4;
                uStack_12e8 = (args.context)->instPrimID[0];
                uStack_12e4 = uStack_12e8;
                uStack_12e0 = uStack_12e8;
                uStack_12dc = uStack_12e8;
                local_1508 = *local_14f8;
                args.valid = (int *)local_1508;
                args.geometryUserPtr = pGVar6->userPtr;
                args.hit = local_1368;
                args.N = 4;
                args.ray = (RTCRayN *)ray;
                if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar6->occlusionFilterN)(&args);
                }
                if (local_1508 == (undefined1  [16])0x0) {
                  auVar32 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                  auVar32 = auVar32 ^ _DAT_01f7ae20;
                }
                else {
                  p_Var8 = context->args->filter;
                  if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var8)(&args);
                  }
                  auVar37 = vpcmpeqd_avx(local_1508,_DAT_01f7aa10);
                  auVar32 = auVar37 ^ _DAT_01f7ae20;
                  auVar45._8_4_ = 0xff800000;
                  auVar45._0_8_ = 0xff800000ff800000;
                  auVar45._12_4_ = 0xff800000;
                  auVar37 = vblendvps_avx(auVar45,*(undefined1 (*) [16])(args.ray + 0x80),auVar37);
                  *(undefined1 (*) [16])(args.ray + 0x80) = auVar37;
                }
                auVar42._8_8_ = 0x100000001;
                auVar42._0_8_ = 0x100000001;
                if ((auVar42 & auVar32) != (undefined1  [16])0x0) goto LAB_005cfadf;
                *(float *)(ray + k * 4 + 0x80) = fVar2;
              }
              uVar13 = uVar13 ^ 1L << (uVar19 & 0x3f);
            } while (uVar13 != 0);
          }
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != local_14d8);
    }
    bVar31 = local_14e8 != stack;
    auVar50 = ZEXT3264(local_11f8);
    auVar54 = ZEXT3264(local_1218);
    auVar55 = ZEXT3264(local_1238);
    auVar59 = ZEXT3264(local_1258);
    auVar64 = ZEXT3264(local_1278);
    auVar68 = ZEXT3264(local_1298);
    auVar74 = ZEXT3264(local_12b8);
    auVar76 = ZEXT3264(local_12d8);
    uVar27 = local_14f0;
    if (!bVar31) {
      return bVar31;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }